

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O0

int ncnn::rnn(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Mat *in_RCX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  Mat *in_R8;
  Mat *in_R9;
  double dVar7;
  Mat *in_stack_00000008;
  float H_1;
  int q_1;
  float *output_data;
  int i_1;
  int i;
  float H;
  float *weight_hc_ptr;
  float *weight_xc_ptr;
  int q;
  float *x;
  int ti;
  int t;
  Mat gates;
  int num_output;
  int T;
  int size;
  Allocator *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  float fVar8;
  undefined8 in_stack_fffffffffffffea8;
  Mat *in_stack_fffffffffffffeb0;
  int local_fc;
  int local_e4;
  int local_d4;
  int local_d0;
  float local_cc;
  int local_b4;
  int local_a4;
  Mat local_90;
  int local_44;
  int local_40;
  int local_3c;
  Mat *local_38;
  Mat *local_30;
  Mat *local_28;
  int local_1c;
  Mat *local_18;
  Mat *local_10;
  int local_4;
  
  local_3c = in_RDI->w;
  local_40 = in_RDI->h;
  local_44 = in_RSI->w;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  Mat::Mat(in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98);
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  if (bVar2) {
    local_4 = -100;
  }
  else {
    for (local_a4 = 0; local_a4 < local_40; local_a4 = local_a4 + 1) {
      if (local_1c == 0) {
        local_fc = local_a4;
      }
      else {
        local_fc = (local_40 + -1) - local_a4;
      }
      pfVar3 = Mat::row(local_10,local_fc);
      for (local_b4 = 0; local_b4 < local_44; local_b4 = local_b4 + 1) {
        pfVar4 = Mat::row(local_28,local_b4);
        pfVar5 = Mat::row(local_38,local_b4);
        pfVar6 = Mat::operator[](local_30,(long)local_b4);
        local_cc = *pfVar6;
        for (local_d0 = 0; local_d0 < local_3c; local_d0 = local_d0 + 1) {
          local_cc = pfVar4[local_d0] * pfVar3[local_d0] + local_cc;
        }
        for (local_d4 = 0; local_d4 < local_44; local_d4 = local_d4 + 1) {
          fVar1 = pfVar5[local_d4];
          pfVar4 = Mat::operator[](in_stack_00000008,(long)local_d4);
          local_cc = fVar1 * *pfVar4 + local_cc;
        }
        dVar7 = std::tanh((double)(ulong)(uint)local_cc);
        pfVar4 = Mat::operator[](&local_90,(long)local_b4);
        *pfVar4 = SUB84(dVar7,0);
      }
      pfVar3 = Mat::row(local_18,local_fc);
      for (local_e4 = 0; local_e4 < local_44; local_e4 = local_e4 + 1) {
        pfVar4 = Mat::operator[](&local_90,(long)local_e4);
        fVar1 = *pfVar4;
        fVar8 = fVar1;
        pfVar4 = Mat::operator[](in_stack_00000008,(long)local_e4);
        *pfVar4 = fVar8;
        pfVar3[local_e4] = fVar1;
      }
    }
    local_4 = 0;
  }
  Mat::~Mat((Mat *)0x51cb17);
  return local_4;
}

Assistant:

static int rnn(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);

        for (int q = 0; q < num_output; q++)
        {
            const float* weight_xc_ptr = weight_xc.row(q);

            const float* weight_hc_ptr = weight_hc.row(q);

            float H = bias_c[q];

            for (int i = 0; i < size; i++)
            {
                H += weight_xc_ptr[i] * x[i];
            }

            for (int i = 0; i < num_output; i++)
            {
                H += weight_hc_ptr[i] * hidden_state[i];
            }

            H = tanh(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}